

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,CaseStatement *stmt)

{
  pointer pIVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  Statement *this_01;
  bool bVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  ItemGroup *item;
  pointer pIVar8;
  long lVar9;
  pair<const_slang::ast::Statement_*,_bool> pVar10;
  int *local_58;
  
  ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
            (stmt->expr,stmt->expr,(TestAnalysis *)this);
  pVar10 = ast::CaseStatement::getKnownBranch(stmt,&(this->super_FlowAnalysisBase).evalContext);
  local_58 = &this->state;
  iVar6 = this->state;
  sVar2 = (stmt->items)._M_extent._M_extent_value;
  if (sVar2 == 0) {
    iVar7 = 0;
  }
  else {
    pIVar8 = (stmt->items)._M_ptr;
    pIVar1 = pIVar8 + sVar2;
    iVar7 = 0;
    do {
      if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (piVar5 = local_58, pVar10.first == (pIVar8->stmt).ptr)) {
        this->isStateSplit = false;
        this->state = iVar6;
        this->stateWhenTrue = 0;
        piVar5 = &this->stateWhenFalse;
      }
      *piVar5 = 0;
      sVar2 = (pIVar8->expressions)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        ppEVar3 = (pIVar8->expressions)._M_ptr;
        lVar9 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar3 + lVar9);
          ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                    (this_00,this_00,(TestAnalysis *)this);
          lVar9 = lVar9 + 8;
        } while (sVar2 << 3 != lVar9);
      }
      ast::Statement::visit<TestAnalysis&>((pIVar8->stmt).ptr,(TestAnalysis *)this);
      iVar7 = iVar7 + this->state;
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != pIVar1);
  }
  bVar4 = FlowAnalysisBase::isFullyCovered(&this->super_FlowAnalysisBase,stmt);
  this_01 = stmt->defaultCase;
  if (this_01 == (Statement *)0x0) {
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar6 = 0;
    }
    if (bVar4) {
      iVar6 = 0;
    }
  }
  else {
    if (!bVar4 && (pVar10.second & pVar10.first != this_01) == 0) {
      this->isStateSplit = false;
      this->state = iVar6;
      this->stateWhenTrue = 0;
      local_58 = &this->stateWhenFalse;
    }
    *local_58 = 0;
    ast::Statement::visit<TestAnalysis&>(this_01,(TestAnalysis *)this);
    iVar6 = this->state;
  }
  this->isStateSplit = false;
  this->state = iVar6 + iVar7;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  return;
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }